

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Generators::Generators<unsigned_long_long>::populate
          (Generators<unsigned_long_long> *this,unsigned_long_long *val)

{
  IGenerator<unsigned_long_long> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<unsigned_long_long>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  value<unsigned_long_long>((Generators *)&local_18,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<unsigned_long_long>,std::allocator<Catch::Generators::GeneratorWrapper<unsigned_long_long>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<unsigned_long_long>>
            ((vector<Catch::Generators::GeneratorWrapper<unsigned_long_long>,std::allocator<Catch::Generators::GeneratorWrapper<unsigned_long_long>>>
              *)&this->m_generators,(GeneratorWrapper<unsigned_long_long> *)&local_18);
  if (local_18._M_head_impl != (IGenerator<unsigned_long_long> *)0x0) {
    (*((local_18._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }